

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pyraminx.cpp
# Opt level: O1

int __thiscall Pyraminx::count_correct_edge(Pyraminx *this)

{
  Face *this_00;
  Color CVar1;
  Color CVar2;
  Color CVar3;
  Color CVar4;
  int i;
  uint uVar5;
  int iVar6;
  int iVar7;
  Corner CVar8;
  uint uVar9;
  Pyraminx *pPVar10;
  shared_ptr<Face> adjacent_face;
  shared_ptr<Face> current_face;
  Face *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  Corner local_64;
  Face *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  Pyraminx *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_60 = (this->blue_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58._M_pi =
       (this->blue_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
    }
  }
  local_38 = &(this->blue_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  iVar7 = 0;
  CVar8 = B;
  local_50 = this;
  do {
    this_00 = (local_60->neighbors).U_neighbor_right.
              super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    _Stack_70._M_pi =
         (local_60->neighbors).U_neighbor_right.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Stack_70._M_pi)->_M_use_count = (_Stack_70._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Stack_70._M_pi)->_M_use_count = (_Stack_70._M_pi)->_M_use_count + 1;
      }
    }
    CVar1 = Face::get_triangle_color(local_60,U,1,2);
    CVar2 = Face::get_triangle_color(local_60,U,2,4);
    CVar3 = Face::get_triangle_color(this_00,U,1,0);
    local_64 = CVar8;
    CVar4 = Face::get_triangle_color(this_00,U,2,0);
    uVar9 = 0;
    uVar5 = 0;
    if (CVar1 == local_60->center_color) {
      uVar5 = (uint)(CVar3 == this_00->center_color);
    }
    if (CVar2 == local_60->center_color) {
      uVar9 = (uint)(CVar4 == this_00->center_color);
    }
    local_60 = this_00;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_58,&_Stack_70);
    CVar8 = local_64;
    if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
    }
    iVar7 = iVar7 + uVar5 + uVar9;
    CVar8 = CVar8 - L;
  } while (CVar8 != U);
  local_40 = &(local_50->red_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_48 = &(local_50->yellow_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
  iVar6 = 0;
  pPVar10 = local_50;
  do {
    local_78 = (Face *)0x0;
    _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (iVar6 == 2) {
      local_78 = (pPVar10->blue_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_70,local_38);
      CVar8 = B;
    }
    else if (iVar6 == 1) {
      local_78 = (pPVar10->red_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_70,local_40);
      CVar8 = R;
    }
    else {
      CVar8 = local_64;
      if (iVar6 == 0) {
        local_78 = (pPVar10->yellow_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_70,local_48);
        CVar8 = L;
      }
    }
    CVar1 = Face::get_triangle_color
                      ((pPVar10->green_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,CVar8,3,2);
    CVar2 = Face::get_triangle_color
                      ((pPVar10->green_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,CVar8,3,4);
    CVar3 = Face::get_triangle_color(local_78,U,3,2);
    local_64 = CVar8;
    CVar4 = Face::get_triangle_color(local_78,U,3,4);
    pPVar10 = local_50;
    uVar5 = 0;
    uVar9 = 0;
    if (CVar1 == green) {
      uVar9 = (uint)(CVar4 == local_78->center_color);
    }
    if (CVar2 == green) {
      uVar5 = (uint)(CVar3 == local_78->center_color);
    }
    if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
    }
    iVar7 = iVar7 + uVar9 + uVar5;
    iVar6 = iVar6 + 1;
  } while (iVar6 != 3);
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
  }
  return iVar7;
}

Assistant:

int Pyraminx::count_correct_edge(){
    int count = 0;
    // Check the edges between faces sharing the upper corner
    std::shared_ptr<Face> current_face = blue_face;
    for(int i = 0; i < 3; i++){
        std::shared_ptr<Face> adjacent_face = current_face->neighbors.U_neighbor_right;
        Color current_top = current_face->get_triangle_color(Corner::U, 1, 2);
        Color current_bottom = current_face->get_triangle_color(Corner::U, 2, 4);
        Color adjacent_top = adjacent_face->get_triangle_color(Corner::U, 1, 0);
        Color adjacent_bottom = adjacent_face->get_triangle_color(Corner::U, 2, 0);
        int top_correct = (current_top == current_face->get_center_color()) 
            && (adjacent_top == adjacent_face->get_center_color());
        int bottom_correct = (current_bottom == current_face->get_center_color()) 
            && (adjacent_bottom == adjacent_face->get_center_color());
        count = count + top_correct + bottom_correct;
        current_face = adjacent_face;
    }
    // Check the edges between the bottom face (green) and the others
    for(int i = 0; i < 3; i++){
        std::shared_ptr<Face> adjacent_face;
        Corner current_corner;
        switch (i)
        {
        case 0:
            current_corner = Corner::L;
            adjacent_face = yellow_face;
            break;
        case 1:
            current_corner = Corner::R;
            adjacent_face = red_face;
            break;
        case 2:
            current_corner = Corner::B;
            adjacent_face = blue_face;
            break;
        }

        Color current_left  = green_face->get_triangle_color(current_corner, 3, 2);
        Color current_right = green_face->get_triangle_color(current_corner, 3, 4);

        Color adjacent_right = adjacent_face->get_triangle_color(Corner::U, 3, 2);
        Color adjacent_left = adjacent_face->get_triangle_color(Corner::U, 3, 4);

        int left_correct = (current_left == Color::green) && (adjacent_left == adjacent_face->get_center_color());
        int right_correct = (current_right == Color::green) && (adjacent_right == adjacent_face->get_center_color());

        count = count + left_correct + right_correct;
    }
    //printf("Correct edge pieces: %i/12\n", count);
    return count;
}